

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void __thiscall cmDocumentation::SetSection(cmDocumentation *this,char *name,char *(*docs) [2])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmDocumentationSection sec;
  allocator<char> local_99;
  cmDocumentationSection local_98;
  cmDocumentationSection local_60;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,name,&local_99);
  local_98.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmDocumentationSection::Append(&local_98,docs);
  paVar1 = &local_60.Name.field_2;
  paVar2 = &local_98.Name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.Name._M_dataplus._M_p == paVar2) {
    local_60.Name.field_2._8_8_ = local_98.Name.field_2._8_8_;
    local_60.Name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.Name._M_dataplus._M_p = local_98.Name._M_dataplus._M_p;
  }
  local_60.Name.field_2._M_allocated_capacity._1_7_ =
       local_98.Name.field_2._M_allocated_capacity._1_7_;
  local_60.Name.field_2._M_local_buf[0] = local_98.Name.field_2._M_local_buf[0];
  local_60.Name._M_string_length = local_98.Name._M_string_length;
  local_98.Name._M_string_length = 0;
  local_98.Name.field_2._M_local_buf[0] = '\0';
  local_60.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_98.Entries.
       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_60.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_98.Entries.
       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_60.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.Entries.
       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_98.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.Name._M_dataplus._M_p = (pointer)paVar2;
  SetSection(this,name,&local_60);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
            (&local_60.Entries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.Name._M_dataplus._M_p,local_60.Name.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
            (&local_98.Entries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.Name._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.Name._M_dataplus._M_p,
                    CONCAT71(local_98.Name.field_2._M_allocated_capacity._1_7_,
                             local_98.Name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name, const char* docs[][2])
{
  cmDocumentationSection sec{ name };
  sec.Append(docs);
  this->SetSection(name, std::move(sec));
}